

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O1

void benchmark::ToExponentAndMantissa
               (double val,double thresh,int precision,double one_k,string *mantissa,
               int64_t *exponent)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  stringstream mantissa_stream;
  double local_1e8;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  double local_1b8;
  double local_1b0;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  local_1b8 = thresh;
  local_1b0 = one_k;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1e8 = val;
  if (val < 0.0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"-",1);
    local_1e8 = -val;
  }
  dVar4 = pow(10.0,(double)precision);
  dVar5 = 1.0 / dVar4;
  if (1.0 / dVar4 <= local_1b8) {
    dVar5 = local_1b8;
  }
  if (local_1e8 <= dVar5 * local_1b0) {
    if (local_1e8 < dVar5) {
      lVar1 = 1;
      dVar4 = local_1e8;
      do {
        lVar2 = lVar1;
        dVar4 = dVar4 * local_1b0;
        if (dVar5 <= dVar4) {
          std::ostream::_M_insert<double>(dVar4);
          *exponent = -lVar2;
          std::__cxx11::stringbuf::str();
          goto LAB_0010f042;
        }
        lVar1 = lVar2 + 1;
      } while (lVar2 + 1 != 10);
      std::ostream::_M_insert<double>(local_1e8);
      uVar3 = lVar2 - 1;
      goto LAB_0010efc9;
    }
    std::ostream::_M_insert<double>(local_1e8);
    *exponent = 0;
  }
  else {
    lVar1 = -1;
    dVar4 = local_1e8;
    do {
      dVar4 = dVar4 / local_1b0;
      if (dVar4 <= dVar5 * local_1b0) {
        std::ostream::_M_insert<double>(dVar4);
        *exponent = lVar1 + 2;
        std::__cxx11::stringbuf::str();
        goto LAB_0010f042;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    std::ostream::_M_insert<double>(local_1e8);
    uVar3 = 8;
LAB_0010efc9:
    *exponent = 0;
    if (uVar3 < 8) goto LAB_0010f064;
  }
  std::__cxx11::stringbuf::str();
LAB_0010f042:
  std::__cxx11::string::operator=((string *)mantissa,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
LAB_0010f064:
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void ToExponentAndMantissa(double val, double thresh, int precision,
                           double one_k, std::string* mantissa,
                           int64_t* exponent) {
  std::stringstream mantissa_stream;

  if (val < 0) {
    mantissa_stream << "-";
    val = -val;
  }

  // Adjust threshold so that it never excludes things which can't be rendered
  // in 'precision' digits.
  const double adjusted_threshold =
      std::max(thresh, 1.0 / std::pow(10.0, precision));
  const double big_threshold = adjusted_threshold * one_k;
  const double small_threshold = adjusted_threshold;

  if (val > big_threshold) {
    // Positive powers
    double scaled = val;
    for (size_t i = 0; i < arraysize(kBigSIUnits); ++i) {
      scaled /= one_k;
      if (scaled <= big_threshold) {
        mantissa_stream << scaled;
        *exponent = i + 1;
        *mantissa = mantissa_stream.str();
        return;
      }
    }
    mantissa_stream << val;
    *exponent = 0;
  } else if (val < small_threshold) {
    // Negative powers
    double scaled = val;
    for (size_t i = 0; i < arraysize(kSmallSIUnits); ++i) {
      scaled *= one_k;
      if (scaled >= small_threshold) {
        mantissa_stream << scaled;
        *exponent = -static_cast<int64_t>(i + 1);
        *mantissa = mantissa_stream.str();
        return;
      }
    }
    mantissa_stream << val;
    *exponent = 0;
  } else {
    mantissa_stream << val;
    *exponent = 0;
  }
  *mantissa = mantissa_stream.str();
}